

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void xmlHashScanFull(xmlHashTablePtr hash,xmlHashScannerFull scan,void *data)

{
  uint uVar1;
  uint uVar2;
  xmlHashEntry *pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  xmlChar *pxVar8;
  uint uVar9;
  xmlChar *pxVar10;
  xmlHashEntry *pxVar11;
  
  if ((hash != (xmlHashTablePtr)0x0) &&
     (uVar1 = hash->size, scan != (xmlHashScannerFull)0x0 && (ulong)uVar1 != 0)) {
    pxVar3 = hash->table;
    uVar9 = pxVar3->hashValue;
    pxVar11 = pxVar3;
    while (uVar9 != 0) {
      pxVar11 = pxVar11 + 1;
      if (pxVar3 + uVar1 <= pxVar11) {
        pxVar11 = pxVar3;
      }
      uVar9 = pxVar11->hashValue;
    }
    uVar9 = 0;
    do {
      if ((pxVar11->hashValue != 0) && (pxVar11->payload != (void *)0x0)) {
        pxVar4 = pxVar11->key;
        pxVar5 = pxVar11->key2;
        pxVar6 = pxVar11->key3;
        (*scan)(pxVar11->payload,data,pxVar4,pxVar5,pxVar6);
        uVar2 = pxVar11->hashValue;
        while ((uVar2 != 0 && (pxVar11->payload != (void *)0x0))) {
          pxVar7 = pxVar11->key;
          pxVar8 = pxVar11->key2;
          if (pxVar7 == pxVar4) {
            pxVar10 = pxVar11->key3;
            if (pxVar6 == pxVar10 && pxVar5 == pxVar8) break;
          }
          else {
            pxVar10 = pxVar11->key3;
          }
          (*scan)(pxVar11->payload,data,pxVar7,pxVar8,pxVar10);
          uVar2 = pxVar11->hashValue;
          pxVar4 = pxVar7;
          pxVar5 = pxVar8;
          pxVar6 = pxVar10;
        }
      }
      pxVar11 = pxVar11 + 1;
      if (pxVar3 + uVar1 <= pxVar11) {
        pxVar11 = hash->table;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < hash->size);
  }
  return;
}

Assistant:

void
xmlHashScanFull(xmlHashTablePtr hash, xmlHashScannerFull scan, void *data) {
    const xmlHashEntry *entry, *end;
    xmlHashEntry old;
    unsigned i;

    if ((hash == NULL) || (hash->size == 0) || (scan == NULL))
        return;

    /*
     * We must handle the case that a scanned entry is removed when executing
     * the callback (xmlCleanSpecialAttr and possibly other places).
     *
     * Find the start of a probe sequence to avoid scanning entries twice if
     * a deletion happens.
     */
    entry = hash->table;
    end = &hash->table[hash->size];
    while (entry->hashValue != 0) {
        if (++entry >= end)
            entry = hash->table;
    }

    for (i = 0; i < hash->size; i++) {
        if ((entry->hashValue != 0) && (entry->payload != NULL)) {
            /*
             * Make sure to rescan after a possible deletion.
             */
            do {
                old = *entry;
                scan(entry->payload, data, entry->key, entry->key2, entry->key3);
            } while ((entry->hashValue != 0) &&
                     (entry->payload != NULL) &&
                     ((entry->key != old.key) ||
                      (entry->key2 != old.key2) ||
                      (entry->key3 != old.key3)));
        }
        if (++entry >= end)
            entry = hash->table;
    }
}